

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int k;
  int iVar21;
  long lVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int local_8c;
  
  if (0 < partitionCount) {
    uVar17 = 0;
    do {
      iVar3 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar17]];
      iVar4 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar17] + 1];
      lVar22 = (long)iVar4;
      pdVar8 = this->gPartials[bufferIndices[uVar17]];
      pdVar9 = this->gCategoryWeights[categoryWeightsIndices[uVar17]];
      pdVar10 = this->gStateFrequencies[stateFrequenciesIndices[uVar17]];
      uVar5 = cumulativeScaleIndices[uVar17];
      iVar6 = this->kStateCount;
      iVar7 = this->kPartialsPaddedStateCount;
      local_8c = iVar6 * iVar3;
      iVar15 = iVar7 * iVar3;
      if (iVar3 < iVar4) {
        pdVar11 = this->integrationTmp;
        iVar18 = iVar3;
        iVar19 = local_8c;
        do {
          if (0 < iVar6) {
            iVar21 = 0;
            lVar13 = 0;
            do {
              *(double *)((long)pdVar11 + lVar13 + (long)iVar19 * 8) =
                   *(double *)((long)pdVar8 + lVar13 + (long)iVar15 * 8) * *pdVar9;
              lVar13 = lVar13 + 8;
              iVar21 = iVar21 + -1;
            } while (-iVar6 != iVar21);
            iVar19 = iVar19 - iVar21;
            iVar15 = iVar15 - iVar21;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar4);
      }
      iVar18 = this->kCategoryCount;
      if (1 < (long)iVar18) {
        iVar19 = this->kPatternCount;
        lVar13 = 1;
        do {
          iVar15 = iVar15 + ((iVar3 - iVar4) + iVar19) * iVar7;
          if (iVar3 < iVar4) {
            pdVar11 = this->integrationTmp;
            iVar21 = iVar3;
            iVar20 = local_8c;
            do {
              if (0 < iVar6) {
                iVar16 = 0;
                lVar14 = 0;
                do {
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = *(ulong *)((long)pdVar8 + lVar14 + (long)iVar15 * 8);
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = pdVar9[lVar13];
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = *(ulong *)((long)pdVar11 + lVar14 + (long)iVar20 * 8);
                  auVar25 = vfmadd213sd_fma(auVar27,auVar24,auVar25);
                  *(long *)((long)pdVar11 + lVar14 + (long)iVar20 * 8) = auVar25._0_8_;
                  lVar14 = lVar14 + 8;
                  iVar16 = iVar16 + -1;
                } while (-iVar6 != iVar16);
                iVar20 = iVar20 - iVar16;
                iVar15 = iVar15 - iVar16;
              }
              iVar21 = iVar21 + 1;
            } while (iVar21 != iVar4);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar18);
      }
      lVar14 = (long)iVar3;
      lVar13 = lVar14;
      if (iVar3 < iVar4) {
        do {
          iVar6 = this->kStateCount;
          if ((long)iVar6 < 1) {
            dVar23 = 0.0;
          }
          else {
            auVar25 = ZEXT816(0);
            lVar12 = 0;
            do {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = pdVar10[lVar12];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = this->integrationTmp[local_8c + lVar12];
              auVar25 = vfmadd231sd_fma(auVar25,auVar28,auVar1);
              dVar23 = auVar25._0_8_;
              lVar12 = lVar12 + 1;
            } while (iVar6 != lVar12);
            local_8c = local_8c + iVar6;
          }
          dVar23 = log(dVar23);
          this->outLogLikelihoodsTmp[lVar13] = dVar23;
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar22);
      }
      if ((-1 < (int)uVar5) && (iVar3 < iVar4)) {
        pdVar8 = this->gScaleBuffers[uVar5];
        pdVar9 = this->outLogLikelihoodsTmp;
        lVar13 = lVar14;
        do {
          pdVar9[lVar13] = pdVar8[lVar13] + pdVar9[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar22 != lVar13);
      }
      outSumLogLikelihoodByPartition[uVar17] = 0.0;
      if (iVar3 < iVar4) {
        pdVar8 = this->gPatternWeights;
        pdVar9 = this->outLogLikelihoodsTmp;
        auVar26 = ZEXT864((ulong)outSumLogLikelihoodByPartition[uVar17]);
        do {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = pdVar9[lVar14];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar8[lVar14];
          auVar25 = vfmadd231sd_fma(auVar26._0_16_,auVar29,auVar2);
          auVar26 = ZEXT1664(auVar25);
          outSumLogLikelihoodByPartition[uVar17] = auVar25._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar22 != lVar14);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}